

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SmallVector.h
# Opt level: O3

int __thiscall
slang::
SmallVectorBase<std::span<const_slang::ast::CoverageBinSymbol::TransRangeList,_18446744073709551615UL>_>
::copy(SmallVectorBase<std::span<const_slang::ast::CoverageBinSymbol::TransRangeList,_18446744073709551615UL>_>
       *this,EVP_PKEY_CTX *dst,EVP_PKEY_CTX *src)

{
  size_type sVar1;
  undefined8 uVar2;
  byte *pbVar3;
  byte *pbVar4;
  pointer psVar5;
  byte *pbVar6;
  pointer psVar7;
  byte *pbVar8;
  
  sVar1 = this->len;
  if (sVar1 == 0) {
    return 0;
  }
  pbVar3 = (byte *)(*(long *)(*(long *)dst + 8) + 7U & 0xfffffffffffffff8);
  pbVar6 = pbVar3 + sVar1 * 0x10;
  if (*(byte **)(dst + 8) < pbVar6) {
    pbVar4 = BumpAllocator::allocateSlow((BumpAllocator *)dst,sVar1 * 0x10,8);
    sVar1 = this->len;
    if (sVar1 == 0) goto LAB_0023841c;
    psVar5 = this->data_;
    psVar7 = psVar5 + sVar1;
    pbVar6 = pbVar4 + sVar1 * 0x10;
    pbVar3 = pbVar4;
  }
  else {
    *(byte **)(*(long *)dst + 8) = pbVar6;
    psVar5 = this->data_;
    psVar7 = psVar5 + sVar1;
    pbVar4 = pbVar3;
  }
  do {
    pbVar8 = pbVar3 + 0x10;
    uVar2 = (psVar5->_M_extent)._M_extent_value;
    *(pointer *)pbVar3 = psVar5->_M_ptr;
    *(undefined8 *)(pbVar3 + 8) = uVar2;
    if (psVar5 + 1 == psVar7) break;
    psVar5 = psVar5 + 1;
    pbVar3 = pbVar8;
  } while (pbVar8 != pbVar6);
LAB_0023841c:
  return (int)pbVar4;
}

Assistant:

[[nodiscard]] std::span<T> copy(BumpAllocator& alloc) const {
        if (len == 0)
            return {};

        pointer dest = reinterpret_cast<pointer>(alloc.allocate(len * sizeof(T), alignof(T)));
        std::ranges::uninitialized_copy(begin(), end(), dest, dest + len);

        return std::span<T>(dest, len);
    }